

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

BUFFER_HANDLE BUFFER_create_with_size(size_t buff_size)

{
  BUFFER_HANDLE __ptr;
  uchar *puVar1;
  LOGGER_LOG p_Var2;
  
  __ptr = (BUFFER_HANDLE)calloc(1,0x10);
  if (__ptr == (BUFFER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/buffer.c"
                ,"BUFFER_create_with_size",0x7b,1,"unable to allocate BUFFER");
      return (BUFFER_HANDLE)0x0;
    }
  }
  else {
    if (buff_size == 0) {
      __ptr->buffer = (uchar *)0x0;
      __ptr->size = 0;
      return __ptr;
    }
    __ptr->size = buff_size;
    puVar1 = (uchar *)malloc(buff_size);
    __ptr->buffer = puVar1;
    if (puVar1 != (uchar *)0x0) {
      return __ptr;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/buffer.c"
                ,"BUFFER_create_with_size",0x72,1,"unable to allocate buffer");
    }
    free(__ptr);
  }
  return (BUFFER_HANDLE)0x0;
}

Assistant:

BUFFER_HANDLE BUFFER_create_with_size(size_t buff_size)
{
    BUFFER* result;
    result = (BUFFER*)calloc(1, sizeof(BUFFER));
    if (result != NULL)
    {
        if (buff_size == 0)
        {
            // Codes_SRS_BUFFER_07_030: [ If buff_size is 0 BUFFER_create_with_size shall create a valid non-NULL handle of zero size. ]
            result->size = 0;
            result->buffer = NULL;
        }
        else
        {
            // Codes_SRS_BUFFER_07_031: [ BUFFER_create_with_size shall allocate a buffer of buff_size. ]
            result->size = buff_size;
            if ((result->buffer = (unsigned char*)malloc(result->size)) == NULL)
            {
                // Codes_SRS_BUFFER_07_032: [ If allocating memory fails, then BUFFER_create_with_size shall return NULL. ]
                LogError("unable to allocate buffer");
                free(result);
                result = NULL;
            }
        }
    }
    else
    {
        // Codes_SRS_BUFFER_07_032: [ If allocating memory fails, then BUFFER_create_with_size shall return NULL. ]
        LogError("unable to allocate BUFFER");
    }
    // Codes_SRS_BUFFER_07_033: [ Otherwise, BUFFER_create_with_size shall return a non-NULL handle. ]
    return (BUFFER_HANDLE)result;
}